

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
Clear<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator)

{
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar1;
  bool bVar2;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> **ppDVar3;
  NodeBase *next;
  NodeBase *current;
  NoThrowHeapAllocator *allocator_local;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this_local;
  
  ppDVar3 = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                      (&this->
                        super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>);
  next = *ppDVar3;
  while( true ) {
    bVar2 = IsHead(this,next);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppDVar3 = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next(next);
    pDVar1 = *ppDVar3;
    Memory::
    DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>>
              (allocator,(DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)next);
    next = pDVar1;
  }
  ppDVar3 = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                      (&this->
                        super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>);
  *ppDVar3 = &this->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
  ppDVar3 = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Prev
                      (&this->
                        super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>);
  *ppDVar3 = &this->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
  RealCount::SetCount(&this->super_RealCount,0);
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }